

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.h
# Opt level: O2

bool Gs::Compare<float,3ul,3ul>(Matrix<float,_3UL,_3UL> *lhs,Matrix<float,_3UL,_3UL> *rhs)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  byte in_CL;
  long lVar4;
  
  uVar3 = 0;
  do {
    if (uVar3 == 3) {
LAB_00106963:
      return (bool)(uVar3 < 3 & in_CL);
    }
    lVar4 = 0;
    while (lVar4 != 3) {
      pfVar1 = (float *)((long)lhs + lVar4 * 4);
      pfVar2 = (float *)((long)rhs + lVar4 * 4);
      lVar4 = lVar4 + 1;
      if (*pfVar1 != *pfVar2) {
        in_CL = *pfVar1 < *pfVar2;
        goto LAB_00106963;
      }
    }
    uVar3 = uVar3 + 1;
    rhs = (Matrix<float,_3UL,_3UL> *)((long)rhs + 0xc);
    lhs = (Matrix<float,_3UL,_3UL> *)((long)lhs + 0xc);
    in_CL = 3;
  } while( true );
}

Assistant:

bool Compare(const Matrix<T, Rows, Cols>& lhs, const Matrix<T, Rows, Cols>& rhs)
{
    /*
    Alwasy compare in the same order (no matter if row-major storage is used or not),
    to ensure always the same sorting results for strict-weak-ordering
    */
    for (std::size_t c = 0; c < Cols; ++c)
    {
        for (std::size_t r = 0; r < Rows; ++r)
        {
            if (lhs(r, c) < rhs(r, c))
                return true;
            if (lhs(r, c) > rhs(r, c))
                return false;
        }
    }
    return false;
}